

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall google::protobuf::FileDescriptorSet::ByteSizeLong(FileDescriptorSet *this)

{
  uint uVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  Type *this_00;
  size_t sVar5;
  uint index;
  size_t sVar6;
  
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    sVar6 = 0;
  }
  else {
    sVar6 = internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  uVar1 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
  sVar6 = sVar6 + uVar1;
  if ((ulong)uVar1 != 0) {
    index = 0;
    do {
      this_00 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                          (&(this->file_).super_RepeatedPtrFieldBase,index);
      sVar5 = FileDescriptorProto::ByteSizeLong(this_00);
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar6 = sVar6 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar1 != index);
  }
  this->_cached_size_ = (int)sVar6;
  return sVar6;
}

Assistant:

size_t FileDescriptorSet::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FileDescriptorSet)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .google.protobuf.FileDescriptorProto file = 1;
  {
    unsigned int count = this->file_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->file(i));
    }
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}